

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O1

int __thiscall ktxSupercompressor::main(ktxSupercompressor *this,int argc,char **argv)

{
  pointer pcVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ktxTexture2 *pkVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ktx_error_code_e kVar8;
  FILE *__stream;
  long lVar9;
  long *plVar10;
  int *piVar11;
  ostream *poVar12;
  FILE *__stream_00;
  char *pcVar13;
  size_t sVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int iVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  pointer pbVar18;
  ktxTexture2 *texture;
  string infile;
  string tmpfile;
  path outputPath;
  ktxTexture2 *local_278;
  path local_270;
  string local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  string *local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_278 = (ktxTexture2 *)0x0;
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  ktxApp::processCommandLine((ktxApp *)this,argc,argv,eAllowStdin,eNone);
  (*(this->super_scApp).super_ktxApp._vptr_ktxApp[4])(this);
  pbVar18 = (this->options).super_commandOptions.super_commandOptions.infiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = 0;
  if (pbVar18 < (this->options).super_commandOptions.super_commandOptions.infiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_1e8 = &(this->options).super_commandOptions.super_commandOptions.outfile;
    local_1e0 = &(this->options).super_commandOptions.inputSwizzle;
    __stream_00 = (FILE *)0x0;
    do {
      paVar3 = &(((path *)local_1b8)->_M_pathname).field_2;
      paVar17 = &local_270._M_pathname.field_2;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      pcVar1 = (pbVar18->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar1,pcVar1 + pbVar18->_M_string_length);
      iVar6 = std::__cxx11::string::compare((char *)&local_248);
      __stream = _stdin;
      if (iVar6 != 0) {
        local_1b8._0_8_ = paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"rb","");
        __stream = fopen(local_248._M_dataplus._M_p,(char *)local_1b8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._0_8_ != paVar3) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
      }
      if (__stream == (FILE *)0x0) {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                             (this->super_scApp).super_ktxApp.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," could not open input file \"",0x1c);
        iVar6 = std::__cxx11::string::compare((char *)&local_248);
        if (iVar6 == 0) {
          local_1b8._0_8_ = &(((path *)local_1b8)->_M_pathname).field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"stdin","");
        }
        else {
          local_1b8._0_8_ = &(((path *)local_1b8)->_M_pathname).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,local_248._M_dataplus._M_p,
                     local_248._M_dataplus._M_p + local_248._M_string_length);
        }
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(char *)local_1b8._0_8_,local_1b8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\". ",3);
        piVar11 = __errno_location();
        pcVar13 = strerror(*piVar11);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
        }
        else {
          sVar14 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._0_8_ != &(((path *)local_1b8)->_M_pathname).field_2) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
LAB_001080d4:
        iVar16 = 5;
        iVar7 = 2;
      }
      else {
        __stream_00 = _stdout;
        if ((this->options).useStdout != true) {
          sVar2 = (this->options).super_commandOptions.super_commandOptions.outfile._M_string_length
          ;
          if (sVar2 == 0) {
            lVar9 = std::__cxx11::string::find_last_of
                              ((char *)&local_248,0x11cd99,0xffffffffffffffff);
            if (lVar9 == -1) {
              local_270._M_pathname._M_string_length = 0;
              local_270._M_pathname.field_2._M_allocated_capacity =
                   local_270._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_270._M_pathname._M_dataplus._M_p = (pointer)paVar17;
            }
            else {
              std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_248);
            }
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
            paVar3 = &(((path *)local_1b8)->_M_pathname).field_2;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 == paVar15) {
              local_1a8[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_1a8[0]._8_8_ = plVar10[3];
              local_1b8._0_8_ = paVar3;
            }
            else {
              local_1a8[0]._0_8_ = paVar15->_M_allocated_capacity;
              local_1b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar10;
            }
            local_1b8._8_8_ = plVar10[1];
            *plVar10 = (long)paVar15;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_208,(string *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._0_8_ != paVar3) {
              operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_pathname._M_dataplus._M_p != paVar17) {
              operator_delete(local_270._M_pathname._M_dataplus._M_p,
                              local_270._M_pathname.field_2._M_allocated_capacity + 1);
            }
            iVar6 = mkstemp(local_208);
            __stream_00 = fdopen(iVar6,"wb");
          }
          else {
            pcVar1 = (local_1e8->_M_dataplus)._M_p;
            local_228 = &local_218;
            std::__cxx11::string::_M_construct<char*>((string *)&local_228,pcVar1,pcVar1 + sVar2);
            if (local_228 == &local_218) {
              local_270._M_pathname.field_2._8_8_ = local_218._8_8_;
              local_270._M_pathname._M_dataplus._M_p = (pointer)paVar17;
            }
            else {
              local_270._M_pathname._M_dataplus._M_p = (pointer)local_228;
            }
            local_270._M_pathname.field_2._M_allocated_capacity._1_7_ =
                 local_218._M_allocated_capacity._1_7_;
            local_270._M_pathname.field_2._M_local_buf[0] = local_218._M_local_buf[0];
            local_270._M_pathname._M_string_length = local_220;
            local_220 = 0;
            local_218._M_local_buf[0] = '\0';
            local_228 = &local_218;
            std::filesystem::__cxx11::path::path
                      ((path *)local_1b8,&local_270._M_pathname,auto_format);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_pathname._M_dataplus._M_p != paVar17) {
              operator_delete(local_270._M_pathname._M_dataplus._M_p,
                              local_270._M_pathname.field_2._M_allocated_capacity + 1);
            }
            if (local_228 != &local_218) {
              operator_delete(local_228,
                              CONCAT71(local_218._M_allocated_capacity._1_7_,
                                       local_218._M_local_buf[0]) + 1);
            }
            cVar5 = std::filesystem::__cxx11::path::has_parent_path();
            if (cVar5 != '\0') {
              std::filesystem::__cxx11::path::parent_path();
              std::filesystem::create_directories(&local_270);
              std::filesystem::__cxx11::path::~path(&local_270);
            }
            __stream_00 = (FILE *)ktxApp::fopen_write_if_not_exists(local_1e8);
            std::filesystem::__cxx11::path::~path((path *)local_1b8);
          }
        }
        if (__stream_00 == (FILE *)0x0) {
          piVar11 = __errno_location();
          if (*piVar11 == 0x11) {
            cVar5 = (this->options).force;
            if ((bool)cVar5 == false) {
              iVar6 = fileno(_stdin);
              iVar6 = isatty(iVar6);
              if (iVar6 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Output file ",0xc);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     (this->options).super_commandOptions.super_commandOptions.
                                     outfile._M_dataplus._M_p,
                                     (this->options).super_commandOptions.super_commandOptions.
                                     outfile._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12," exists. Overwrite? [Y or n] ",0x1d);
                std::operator>>((istream *)&std::cin,(char *)local_1b8);
                if (local_1b8[0] == 'Y') {
                  cVar5 = '\x01';
                }
              }
            }
            if (cVar5 != '\0') {
              paVar3 = &(((path *)local_1b8)->_M_pathname).field_2;
              local_1b8._0_8_ = paVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"wb","");
              __stream_00 = fopen((this->options).super_commandOptions.super_commandOptions.outfile.
                                  _M_dataplus._M_p,(char *)local_1b8._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._0_8_ != paVar3) {
                operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
              }
              goto LAB_00107d49;
            }
          }
          __stream_00 = (FILE *)0x0;
        }
LAB_00107d49:
        if (__stream_00 == (FILE *)0x0) {
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                               (this->super_scApp).super_ktxApp.name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," could not open output file \"",0x1d);
          if ((this->options).useStdout == true) {
            local_1b8._0_8_ = &(((path *)local_1b8)->_M_pathname).field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"stdout","");
          }
          else {
            local_1b8._0_8_ = &(((path *)local_1b8)->_M_pathname).field_2;
            pcVar1 = (this->options).super_commandOptions.super_commandOptions.outfile._M_dataplus.
                     _M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b8,pcVar1,
                       pcVar1 + (this->options).super_commandOptions.super_commandOptions.outfile.
                                _M_string_length);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)local_1b8._0_8_,local_1b8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\". ",3);
          piVar11 = __errno_location();
          pcVar13 = strerror(*piVar11);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar14 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._0_8_ != &(((path *)local_1b8)->_M_pathname).field_2) {
            operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
          }
          iVar16 = 5;
          iVar7 = 2;
          __stream_00 = (FILE *)0x0;
        }
        else {
          iVar6 = ktxTexture2_CreateFromStdioStream(__stream,1,&local_278);
          if (iVar6 != 0) {
            if (iVar6 == 0xf) {
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_248._M_dataplus._M_p,
                                   local_248._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," is not a KTX v2 file.",0x16);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            }
            else {
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                   (this->super_scApp).super_ktxApp.name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," failed to create ktxTexture from ",0x22);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_248._M_dataplus._M_p,local_248._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
              pcVar13 = (char *)ktxErrorString(iVar6);
              if (pcVar13 == (char *)0x0) {
                std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
              }
              else {
                sVar14 = strlen(pcVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            }
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            goto LAB_001080d4;
          }
          fclose(__stream);
          if (local_278->classId == ktxTexture2_c) {
            if (local_278->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
              if ((((this->options).super_commandOptions.etc1s == 0 &&
                    (this->options).super_commandOptions.astc == 0) &&
                  ((this->options).super_commandOptions.bopts.super_ktxBasisParams.uastc != true))
                 || (local_278->isCompressed != true)) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                ktxApp::writeId((ktxApp *)this,
                                (ostream *)&(((path *)local_1b8)->_M_pathname).field_2,true);
                ktxHashList_DeleteKVPair(&local_278->kvDataHead,"KTXwriter");
                pkVar4 = local_278;
                std::__cxx11::stringbuf::str();
                sVar2 = local_270._M_pathname._M_string_length;
                std::__cxx11::stringbuf::str();
                ktxHashList_AddKVPair(&pkVar4->kvDataHead,"KTXwriter",(int)sVar2 + 1,local_1d8);
                if (local_1d8 != local_1c8) {
                  operator_delete(local_1d8,local_1c8[0] + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_pathname._M_dataplus._M_p != &local_270._M_pathname.field_2) {
                  operator_delete(local_270._M_pathname._M_dataplus._M_p,
                                  local_270._M_pathname.field_2._M_allocated_capacity + 1);
                }
                iVar7 = scApp::encode(&this->super_scApp,local_278,local_1e0,&local_248);
                iVar16 = 5;
                if (iVar7 == 0) {
                  kVar8 = (*local_278->vtbl->WriteToStdioStream)
                                    ((ktxTexture *)local_278,(FILE *)__stream_00);
                  if (kVar8 == KTX_SUCCESS) {
                    fclose(__stream_00);
                    iVar7 = 0;
                    if (((this->options).super_commandOptions.super_commandOptions.outfile.
                         _M_string_length == 0) && ((this->options).useStdout == false)) {
                      if ((local_200 == 0) || (local_248._M_string_length == 0)) {
                        __assert_fail("tmpfile.size() > 0 && infile.length()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktxsc/ktxsc.cpp"
                                      ,300,"virtual int ktxSupercompressor::main(int, char **)");
                      }
                      iVar6 = rename(local_208,local_248._M_dataplus._M_p);
                      iVar16 = 0;
                      if (iVar6 != 0) {
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,
                                             (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                             (this->super_scApp).super_ktxApp.name._M_string_length)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,": rename of \"",0xd);
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,local_208,local_200);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" to \"",6);
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,local_248._M_dataplus._M_p,
                                             local_248._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" failed: ",10)
                        ;
                        piVar11 = __errno_location();
                        pcVar13 = strerror(*piVar11);
                        poVar12 = std::operator<<(poVar12,pcVar13);
                        iVar7 = 2;
                        std::endl<char,std::char_traits<char>>(poVar12);
                        iVar16 = 5;
                      }
                    }
                    else {
                      iVar16 = 0;
                    }
                  }
                  else {
                    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,
                                         (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                         (this->super_scApp).super_ktxApp.name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12," failed to write KTX file; ",0x1b);
                    pcVar13 = (char *)ktxErrorString(kVar8);
                    if (pcVar13 == (char *)0x0) {
                      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18))
                      ;
                    }
                    else {
                      sVar14 = strlen(pcVar13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
                    }
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12)
                    ;
                    std::ostream::put((char)poVar12);
                    iVar7 = 2;
                    std::ostream::flush();
                    iVar16 = 5;
                  }
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                std::ios_base::~ios_base(local_138);
                goto LAB_001080df;
              }
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                   (this->super_scApp).super_ktxApp.name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"Cannot encode already block-compressed textures ",0x30);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"to ASTC, Basis Universal or UASTC.",0x22);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            }
            else {
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                   (this->super_scApp).super_ktxApp.name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"Cannot supercompress already supercompressed files.",0x33);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            }
          }
          else {
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 (this->super_scApp).super_ktxApp.name._M_dataplus._M_p,
                                 (this->super_scApp).super_ktxApp.name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"Only KTX texture version 2 files can be supercompressed.",0x38);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          }
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          iVar16 = 5;
          iVar7 = 1;
        }
      }
LAB_001080df:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      iVar6 = 0;
      if (iVar16 != 0) {
        if (iVar16 == 5) {
          if (__stream_00 != (FILE *)0x0) {
            fclose(__stream_00);
          }
          if (local_200 != 0) {
            unlink(local_208);
          }
          iVar6 = iVar7;
          if ((this->options).super_commandOptions.super_commandOptions.outfile._M_string_length !=
              0) {
            unlink((this->options).super_commandOptions.super_commandOptions.outfile._M_dataplus.
                   _M_p);
          }
        }
        break;
      }
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 < (this->options).super_commandOptions.super_commandOptions.infiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  return iVar6;
}

Assistant:

int
ktxSupercompressor::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture2* texture = 0;
    int exitCode = 0;
    string tmpfile;

    processCommandLine(argc, argv, eAllowStdin);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
        string infile = *it;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (options.outfile.length()) {
                const auto outputPath = filesystem::path(DecodeUTF8Path(options.outfile));
                if (outputPath.has_parent_path())
                    filesystem::create_directories(outputPath.parent_path());
                outf = fopen_write_if_not_exists(options.outfile);
            } else {
                // Make a temporary file in the same directory as the source
                // file to avoid cross-device rename issues later.
                tmpfile = dir_name(infile) + "ktxsc.tmp.XXXXXX";
#if defined(_WIN32)
                // Despite receiving size() the debug CRT version of mktemp_s
                // asserts that the string template is NUL terminated.
                tmpfile.push_back('\0');
                if (_wmktemp_s(&DecodeUTF8Path(tmpfile)[0], tmpfile.size()) == 0)
                    outf = fopenUTF8(tmpfile, "wb");
#else
                int fd_tmp = mkstemp(&tmpfile[0]);
                outf = fdopen(fd_tmp, "wb");
#endif
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(options.outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture2_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result == KTX_UNKNOWN_FILE_FORMAT) {
                    cerr << infile << " is not a KTX v2 file." << endl;
                    exitCode = 2;
                    goto cleanup;
                } else if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to create ktxTexture from " << infile
                         << ": " << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(inf);

                if (texture->classId != ktxTexture2_c) {
                    cerr << name << ": "
                         << "Only KTX texture version 2 files can be supercompressed."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if (texture->supercompressionScheme != KTX_SS_NONE) {
                    cerr << name << ": "
                         << "Cannot supercompress already supercompressed files."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if ((options.astc || options.etc1s || options.bopts.uastc) && texture->isCompressed) {
                    cerr << name << ": "
                         << "Cannot encode already block-compressed textures "
                         << "to ASTC, Basis Universal or UASTC."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }

                // Modify the writer metadata.
                stringstream writer;
                writeId(writer, true);
                ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                exitCode = encode(texture, options.inputSwizzle, infile);
                if (exitCode)
                    goto cleanup;
                result = ktxTexture_WriteToStdioStream(ktxTexture(texture), outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX file; "
                         << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(outf);
                if (!options.outfile.length() && !options.useStdout) {
                    // Move the new file over the original.
                    assert(tmpfile.size() > 0 && infile.length());
#if defined(_WIN32)
                    // Windows' rename() fails if the destination file exists!
                    if (!MoveFileExW(DecodeUTF8Path(tmpfile).c_str(), DecodeUTF8Path(infile).c_str(),
                                     MOVEFILE_REPLACE_EXISTING))
#else
                    if (rename(tmpfile.c_str(), infile.c_str()))
#endif
                    {
                        cerr << name
                             << ": rename of \"" << tmpfile << "\" to \""
                             << infile << "\" failed: "
                             << strerror(errno) << endl;
                        exitCode = 2;
                        goto cleanup;
                    }
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.useStdout ? "stdout" : options.outfile) << "\". "
                     << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") == 0 ? "stdin" : infile) << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }
    return 0;

cleanup:
    if (outf) { // Windows debug CRT fclose asserts that outf != nullptr...
        (void)fclose(outf); // N.B Windows refuses to unlink an open file.
    }
    if (tmpfile.size() > 0) (void)unlinkUTF8(tmpfile);
    if (options.outfile.length()) (void)unlinkUTF8(options.outfile);
    return exitCode;
}